

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O3

CVmFmtTabStop * __thiscall CVmFormatter::find_tab(CVmFormatter *this,wchar_t *id,int create)

{
  CVmHashTable *this_00;
  undefined8 *puVar1;
  CVmFmtTabStop *pCVar2;
  
  this_00 = this->tabs_;
  if (this_00 == (CVmHashTable *)0x0) {
    this_00 = (CVmHashTable *)operator_new(0x20);
    puVar1 = (undefined8 *)operator_new(8);
    *puVar1 = &PTR__CVmHashFunc_003658a8;
    CVmHashTable::init(this_00,(EVP_PKEY_CTX *)0x40);
    this->tabs_ = this_00;
  }
  pCVar2 = CVmFmtTabStop::find(this_00,id,create);
  return pCVar2;
}

Assistant:

CVmFmtTabStop *CVmFormatter::find_tab(wchar_t *id, int create)
{
    /* if we don't have a hash table yet, create one */
    if (tabs_ == 0)
        tabs_ = new CVmHashTable(64, new CVmHashFuncCS(), TRUE);

    /* find the tab */
    return CVmFmtTabStop::find(tabs_, id, create);
}